

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D::forward
          (Convolution1D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int ret;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int w;
  Mat bottom_blob_bordered;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  void **ppvVar1;
  Option *in_stack_fffffffffffffcf0;
  Mat *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  bool local_289;
  void *local_250;
  int *piVar2;
  undefined4 uVar3;
  Mat *in_stack_fffffffffffffdc8;
  long *plVar4;
  void *local_200;
  int *local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  long *plVar5;
  void *local_1a8;
  int *local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  long *local_188;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  int local_170;
  long local_168;
  int local_160;
  int local_15c;
  reference local_158;
  const_reference local_150;
  const_reference local_148;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_138;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  int local_11c;
  void **local_118;
  void **local_110;
  void **local_108;
  void **local_100;
  void **local_f0;
  void **local_e0;
  void **local_c8;
  void **local_c0;
  void **local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  int local_80;
  undefined4 local_7c;
  void **local_78;
  int local_60;
  undefined4 local_5c;
  void **local_58;
  void *local_50;
  void *local_40;
  void *local_30;
  void **local_20;
  void **local_18;
  void **local_10;
  
  local_138 = in_RDX;
  local_130 = in_RSI;
  local_148 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_150 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_130,1);
  local_158 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_138,0);
  local_15c = local_150->w;
  local_160 = local_150->c;
  local_118 = &local_1a8;
  local_1a8 = (void *)0x0;
  local_1a0 = (int *)0x0;
  local_198 = 0;
  local_190 = 0;
  local_188 = (long *)0x0;
  local_180 = 0;
  local_17c = 0;
  local_178 = 0;
  local_174 = 0;
  local_170 = 0;
  local_168 = 0;
  flatten((Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
          in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  local_b8 = &local_1a8;
  if (local_1a8 != (void *)0x0) {
    local_20 = local_b8;
  }
  local_289 = local_1a8 != (void *)0x0 && local_168 * local_170 != 0;
  if (local_289) {
    local_110 = &local_200;
    local_200 = (void *)0x0;
    local_1f8 = (int *)0x0;
    local_1f0 = 0;
    local_1e8 = 0;
    plVar5 = (long *)0x0;
    if (*(int *)(in_RDI + 0xec) == 0) {
      plVar5 = (long *)0x0;
      local_1e8 = 0;
      local_1f0 = 0;
      local_1f8 = (int *)0x0;
      local_200 = (void *)0x0;
      local_108 = &local_250;
      local_250 = (void *)0x0;
      piVar2 = (int *)0x0;
      uVar3 = 0;
      plVar4 = (long *)0x0;
      make_padding((Convolution1D *)0x0,(Mat *)0x0,in_stack_fffffffffffffdc8,0,(Option *)0x0);
      local_c8 = &local_250;
      if (local_250 != (void *)0x0) {
        local_10 = local_c8;
      }
      local_11c = -100;
      ppvVar1 = &local_250;
      local_100 = ppvVar1;
      local_58 = ppvVar1;
      if (piVar2 != (int *)0x0) {
        local_5c = 0xffffffff;
        LOCK();
        local_60 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_60 == 1) {
          if (plVar4 == (long *)0x0) {
            local_50 = local_250;
            if (local_250 != (void *)0x0) {
              free(local_250);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))(plVar4,local_250);
          }
        }
      }
      *ppvVar1 = (void *)0x0;
      ppvVar1[2] = (void *)0x0;
      *(undefined4 *)(ppvVar1 + 3) = 0;
      *(undefined4 *)(ppvVar1 + 5) = 0;
      *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
      *(undefined4 *)(ppvVar1 + 6) = 0;
      *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
      *(undefined4 *)(ppvVar1 + 7) = 0;
      ppvVar1[8] = (void *)0x0;
      ppvVar1[1] = (void *)0x0;
    }
    else {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_130,2);
      flatten((Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
              in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      local_c0 = &local_200;
      if (local_200 != (void *)0x0) {
        local_18 = local_c0;
      }
      local_11c = -100;
    }
    ppvVar1 = &local_200;
    local_f0 = ppvVar1;
    local_78 = ppvVar1;
    if (local_1f8 != (int *)0x0) {
      local_7c = 0xffffffff;
      LOCK();
      local_80 = *local_1f8;
      *local_1f8 = *local_1f8 + -1;
      UNLOCK();
      if (local_80 == 1) {
        if (plVar5 == (long *)0x0) {
          local_40 = local_200;
          if (local_200 != (void *)0x0) {
            free(local_200);
          }
        }
        else {
          (**(code **)(*plVar5 + 0x18))(plVar5,local_200);
        }
      }
    }
    *ppvVar1 = (void *)0x0;
    ppvVar1[2] = (void *)0x0;
    *(undefined4 *)(ppvVar1 + 3) = 0;
    *(undefined4 *)(ppvVar1 + 5) = 0;
    *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
    *(undefined4 *)(ppvVar1 + 6) = 0;
    *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
    *(undefined4 *)(ppvVar1 + 7) = 0;
    ppvVar1[8] = (void *)0x0;
    ppvVar1[1] = (void *)0x0;
  }
  else {
    local_11c = -100;
  }
  ppvVar1 = &local_1a8;
  if (local_1a0 != (int *)0x0) {
    local_9c = 0xffffffff;
    LOCK();
    local_a0 = *local_1a0;
    *local_1a0 = *local_1a0 + -1;
    UNLOCK();
    if (local_a0 == 1) {
      local_e0 = ppvVar1;
      local_98 = ppvVar1;
      if (local_188 == (long *)0x0) {
        local_30 = local_1a8;
        if (local_1a8 != (void *)0x0) {
          free(local_1a8);
        }
      }
      else {
        (**(code **)(*local_188 + 0x18))(local_188,local_1a8);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return local_11c;
}

Assistant:

int Convolution1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution1d(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}